

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

void create_hostcache_id(char *name,int port,char *ptr,size_t buflen)

{
  int iVar1;
  size_t local_30;
  size_t len;
  size_t buflen_local;
  char *ptr_local;
  byte *pbStack_10;
  int port_local;
  char *name_local;
  
  local_30 = strlen(name);
  buflen_local = (size_t)ptr;
  pbStack_10 = (byte *)name;
  if (buflen - 7 < local_30) {
    local_30 = buflen - 7;
  }
  while (local_30 != 0) {
    iVar1 = tolower((uint)*pbStack_10);
    *(char *)buflen_local = (char)iVar1;
    local_30 = local_30 - 1;
    buflen_local = buflen_local + 1;
    pbStack_10 = pbStack_10 + 1;
  }
  curl_msnprintf((char *)buflen_local,7,":%u",(ulong)(uint)port);
  return;
}

Assistant:

static void
create_hostcache_id(const char *name, int port, char *ptr, size_t buflen)
{
  size_t len = strlen(name);
  if(len > (buflen - 7))
    len = buflen - 7;
  /* store and lower case the name */
  while(len--)
    *ptr++ = (char)TOLOWER(*name++);
  msnprintf(ptr, 7, ":%u", port);
}